

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff.c
# Opt level: O0

LY_ERR lyd_diff_merge_none(lyd_node *diff_match,lyd_diff_op cur_op,lyd_node *src_diff)

{
  char *__ptr;
  char *pcVar1;
  char *pcVar2;
  ly_ctx *local_40;
  char *__path;
  lyd_node *src_diff_local;
  lyd_diff_op cur_op_local;
  lyd_node *diff_match_local;
  
  if ((cur_op == LYD_DIFF_OP_CREATE) ||
     (cur_op == LYD_DIFF_OP_REPLACE || cur_op == LYD_DIFF_OP_NONE)) {
    if ((src_diff->schema->nodetype & 0xc) != 0) {
      diff_match->flags = diff_match->flags & 0xfffffffe;
      diff_match->flags = src_diff->flags & 1 | diff_match->flags;
    }
    diff_match_local._4_4_ = LY_SUCCESS;
  }
  else {
    __ptr = lyd_path(diff_match,LYD_PATH_STD,(char *)0x0,0);
    if (diff_match->schema == (lysc_node *)0x0) {
      local_40 = (ly_ctx *)diff_match[2].schema;
    }
    else {
      local_40 = diff_match->schema->module->ctx;
    }
    pcVar1 = lyd_diff_op2str(LYD_DIFF_OP_NONE);
    pcVar2 = lyd_diff_op2str(cur_op);
    ly_log(local_40,LY_LLERR,LY_EINVAL,
           "Unable to merge operation \"%s\" with \"%s\" for node \"%s\".",pcVar1,pcVar2,__ptr);
    free(__ptr);
    diff_match_local._4_4_ = LY_EINVAL;
  }
  return diff_match_local._4_4_;
}

Assistant:

static LY_ERR
lyd_diff_merge_none(struct lyd_node *diff_match, enum lyd_diff_op cur_op, const struct lyd_node *src_diff)
{
    switch (cur_op) {
    case LYD_DIFF_OP_NONE:
    case LYD_DIFF_OP_CREATE:
    case LYD_DIFF_OP_REPLACE:
        if (src_diff->schema->nodetype & LYD_NODE_TERM) {
            /* NONE on a term means only its dflt flag was changed */
            diff_match->flags &= ~LYD_DEFAULT;
            diff_match->flags |= src_diff->flags & LYD_DEFAULT;
        }
        break;
    default:
        /* delete operation is not valid */
        LOGERR_MERGEOP(LYD_CTX(diff_match), diff_match, cur_op, LYD_DIFF_OP_NONE);
        return LY_EINVAL;
    }

    return LY_SUCCESS;
}